

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O2

int opj_getopt_long(int argc,char **argv,char *optstring,opj_option_t *longopts,int totlen)

{
  int *piVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *__s;
  long lVar7;
  char cVar8;
  int local_60;
  int local_5c;
  
  local_5c = opj_getopt_long::lastidx;
  local_60 = opj_getopt_long::lastofs;
  cVar8 = '\x01';
  do {
    if (argc <= opj_optind) {
      return -1;
    }
    pcVar6 = argv[opj_optind];
    if (pcVar6 == (char *)0x0) {
      return -1;
    }
    if (*pcVar6 != '-') {
      return -1;
    }
    if (pcVar6[1] == '\0') {
      if ((argc + -1 <= opj_optind) || (cVar8 = '\x02', *argv[(long)opj_optind + 1] == '-')) {
        opj_optind = opj_optind + 1;
        return 0x3f;
      }
LAB_0010e10a:
      iVar5 = opj_optind + 1;
      if (argc <= iVar5) {
        return -1;
      }
      __s = argv[iVar5];
      pcVar6 = __s;
      opj_optind = iVar5;
    }
    else {
      if (cVar8 != '\x01') goto LAB_0010e10a;
      __s = pcVar6 + 1;
      cVar8 = '\x01';
    }
    iVar5 = opj_optind;
    sVar2 = strlen(__s);
    if (1 < sVar2) {
      lVar7 = 0;
      break;
    }
    if (*optstring == ':') {
      return 0x3a;
    }
    if (local_5c != iVar5) {
      opj_getopt_long::lastofs = 0;
      local_60 = 0;
      opj_getopt_long::lastidx = iVar5;
      local_5c = iVar5;
    }
    lVar7 = (long)local_60;
    iVar4 = (int)pcVar6[lVar7 + 1];
    opj_optopt = iVar4;
    pcVar3 = strchr(optstring,iVar4);
    if (pcVar3 == (char *)0x0) {
      pcVar6 = "Invalid option %s\n";
      goto LAB_0010e377;
    }
    if (*pcVar3 != '\0') {
      if (pcVar3[1] != ':') {
        opj_getopt_long::lastofs = local_60 + 1;
        return iVar4;
      }
      if ((pcVar3[2] == ':') || (pcVar6[lVar7 + 2] != '\0')) {
        opj_optarg = (char *)0x0;
        if (pcVar6[lVar7 + 2] != '\0') {
          opj_optarg = pcVar6 + lVar7 + 2;
        }
      }
      else {
        opj_optarg = argv[(long)iVar5 + 1];
        if (((opj_optarg == (char *)0x0) || (*opj_optarg == '-')) && (opj_opterr != 0)) {
          pcVar6 = "%s: option requires an argument\n";
          goto LAB_0010e377;
        }
        iVar5 = iVar5 + 1;
      }
      opj_optind = iVar5 + 1;
      return iVar4;
    }
    opj_optind = iVar5 + 1;
  } while( true );
LAB_0010e1ca:
  if (totlen <= (int)lVar7) {
    pcVar6 = "Invalid option %s\n";
LAB_0010e377:
    fprintf(_stderr,pcVar6,__s);
    opj_optind = opj_optind + 1;
    return 0x3f;
  }
  iVar4 = strcmp(*(char **)((long)&longopts->name + lVar7),__s);
  if (iVar4 == 0) {
    iVar4 = *(int *)((long)&longopts->has_arg + lVar7);
    pcVar6 = argv[(long)iVar5 + 1];
    if (iVar4 == 0) {
      if ((pcVar6 == (char *)0x0) || (*pcVar6 == '-')) goto LAB_0010e2e8;
      fprintf(_stderr,"%s: option does not require an argument. Ignoring %s\n",__s);
      iVar5 = opj_optind;
    }
    else {
      opj_optarg = pcVar6;
      if (pcVar6 == (char *)0x0) {
        if ((iVar4 == 1) && (opj_opterr != 0)) {
          pcVar6 = "%s: option requires an argument \n";
          goto LAB_0010e3af;
        }
      }
      else if ((*pcVar6 == '-') && (opj_opterr != 0)) {
        pcVar6 = "%s: option requires an argument\n";
LAB_0010e3af:
        fprintf(_stderr,pcVar6,__s);
        return 0x3f;
      }
    }
    iVar5 = iVar5 + 1;
LAB_0010e2e8:
    opj_optind = iVar5 + 1;
    piVar1 = *(int **)((long)&longopts->flag + lVar7);
    iVar5 = *(int *)((long)&longopts->val + lVar7);
    if (piVar1 != (int *)0x0) {
      *piVar1 = iVar5;
      return 0;
    }
    return iVar5;
  }
  lVar7 = lVar7 + 0x20;
  goto LAB_0010e1ca;
}

Assistant:

int opj_getopt_long(int argc, char * const argv[], const char *optstring,
                    const opj_option_t *longopts, int totlen)
{
    static int lastidx, lastofs;
    const char *tmp;
    int i, len;
    char param = 1;

again:
    if (opj_optind >= argc || !argv[opj_optind] || *argv[opj_optind] != '-') {
        return -1;
    }

    if (argv[opj_optind][0] == '-' && argv[opj_optind][1] == 0) {
        if (opj_optind >= (argc - 1)) { /* no more input parameters */
            param = 0;
        } else { /* more input parameters */
            if (argv[opj_optind + 1][0] == '-') {
                param = 0; /* Missing parameter after '-' */
            } else {
                param = 2;
            }
        }
    }

    if (param == 0) {
        ++opj_optind;
        return (BADCH);
    }

    if (argv[opj_optind][0] == '-') { /* long option */
        char* arg;
        const opj_option_t* o;
        o = longopts;
        len = sizeof(longopts[0]);

        if (param > 1) {
            if (opj_optind + 1 >= argc) {
                return -1;
            }
            arg = argv[opj_optind + 1];
            opj_optind++;
        } else {
            arg = argv[opj_optind] + 1;
        }

        if (strlen(arg) > 1) {
            for (i = 0; i < totlen; i = i + len, o++) {
                if (!strcmp(o->name, arg)) { /* match */
                    if (o->has_arg == 0) {
                        if ((argv[opj_optind + 1]) && (!(argv[opj_optind + 1][0] == '-'))) {
                            fprintf(stderr, "%s: option does not require an argument. Ignoring %s\n", arg,
                                    argv[opj_optind + 1]);
                            ++opj_optind;
                        }
                    } else {
                        opj_optarg = argv[opj_optind + 1];
                        if (opj_optarg) {
                            if (opj_optarg[0] ==
                                    '-') { /* Has read next input parameter: No arg for current parameter */
                                if (opj_opterr) {
                                    fprintf(stderr, "%s: option requires an argument\n", arg);
                                    return (BADCH);
                                }
                            }
                        }
                        if (!opj_optarg && o->has_arg == 1) { /* no argument there */
                            if (opj_opterr) {
                                fprintf(stderr, "%s: option requires an argument \n", arg);
                                return (BADCH);
                            }
                        }
                        ++opj_optind;
                    }
                    ++opj_optind;
                    if (o->flag) {
                        *(o->flag) = o->val;
                    } else {
                        return o->val;
                    }
                    return 0;
                }
            }/*(end for)String not found in the list*/
            fprintf(stderr, "Invalid option %s\n", arg);
            ++opj_optind;
            return (BADCH);
        } else { /*Single character input parameter*/
            if (*optstring == ':') {
                return ':';
            }
            if (lastidx != opj_optind) {
                lastidx = opj_optind;
                lastofs = 0;
            }
            opj_optopt = argv[opj_optind][lastofs + 1];
            if ((tmp = strchr(optstring, opj_optopt))) { /*Found input parameter in list*/
                if (*tmp == 0) { /* apparently, we looked for \0, i.e. end of argument */
                    ++opj_optind;
                    goto again;
                }
                if (tmp[1] == ':') { /* argument expected */
                    if (tmp[2] == ':' ||
                            argv[opj_optind][lastofs + 2]) { /* "-foo", return "oo" as opj_optarg */
                        if (!*(opj_optarg = argv[opj_optind] + lastofs + 2)) {
                            opj_optarg = 0;
                        }
                        goto found;
                    }
                    opj_optarg = argv[opj_optind + 1];
                    if (opj_optarg) {
                        if (opj_optarg[0] ==
                                '-') { /* Has read next input parameter: No arg for current parameter */
                            if (opj_opterr) {
                                fprintf(stderr, "%s: option requires an argument\n", arg);
                                ++opj_optind;
                                return (BADCH);
                            }
                        }
                    }
                    if (!opj_optarg) {  /* missing argument */
                        if (opj_opterr) {
                            fprintf(stderr, "%s: option requires an argument\n", arg);
                            ++opj_optind;
                            return (BADCH);
                        }
                    }
                    ++opj_optind;
                } else {/*Argument not expected*/
                    ++lastofs;
                    return opj_optopt;
                }
found:
                ++opj_optind;
                return opj_optopt;
            }   else {  /* not found */
                fprintf(stderr, "Invalid option %s\n", arg);
                ++opj_optind;
                return (BADCH);
            }/*end of not found*/

        }/* end of single character*/
    }/*end '-'*/
    fprintf(stderr, "Invalid option\n");
    ++opj_optind;
    return (BADCH);;
}